

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

int AF_A_ScreamAndUnblock(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *self_00;
  DObject *this;
  bool bVar1;
  VMValue *local_a0;
  bool local_92;
  bool local_8f;
  undefined1 local_78 [8];
  VMValue params [3];
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0xc07,
                  "int AF_A_ScreamAndUnblock(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar1 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar1 = true, (param->field_0).field_1.atag != 1)) {
    bVar1 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar1) {
    self_00 = (AActor *)(param->field_0).field_1.a;
    local_8f = true;
    if (self_00 != (AActor *)0x0) {
      local_8f = DObject::IsKindOf((DObject *)self_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_8f != false) {
      if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
        bVar1 = false;
        if ((param[1].field_0.field_3.Type == '\x03') &&
           (bVar1 = true, param[1].field_0.field_1.atag != 1)) {
          bVar1 = param[1].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar1) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                        ,0xc07,
                        "int AF_A_ScreamAndUnblock(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
        this = (DObject *)param[1].field_0.field_1.a;
        local_92 = true;
        if (this != (DObject *)0x0) {
          local_92 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
        }
        if (local_92 == false) {
          __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                        ,0xc07,
                        "int AF_A_ScreamAndUnblock(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
      }
      if ((numparam < 3) || (param[2].field_0.field_3.Type == 0xff)) {
        params[2].field_0._8_8_ = 0;
      }
      else {
        bVar1 = false;
        if ((param[2].field_0.field_3.Type == '\x03') &&
           (bVar1 = true, param[2].field_0.field_1.atag != 8)) {
          bVar1 = param[2].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar1) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                        ,0xc07,
                        "int AF_A_ScreamAndUnblock(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
        params[2].field_0._8_8_ = param[2].field_0.field_1.a;
      }
      VMValue::VMValue((VMValue *)local_78,(DObject *)self_00);
      VMValue::VMValue((VMValue *)((long)&params[0].field_0 + 8),(DObject *)self_00);
      VMValue::VMValue((VMValue *)((long)&params[1].field_0 + 8),(void *)0x0,8);
      VMFrameStack::Call(stack,&A_Scream_VMPtr->super_VMFunction,(VMValue *)local_78,3,
                         (VMReturn *)0x0,0,(VMException **)0x0);
      local_a0 = (VMValue *)((long)&params[2].field_0 + 8);
      do {
        local_a0 = local_a0 + -1;
        VMValue::~VMValue(local_a0);
      } while (local_a0 != (VMValue *)local_78);
      A_Unblock(self_00,true);
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                  ,0xc07,
                  "int AF_A_ScreamAndUnblock(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_enemy.cpp"
                ,0xc07,"int AF_A_ScreamAndUnblock(VMFrameStack *, VMValue *, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ScreamAndUnblock)
{
	PARAM_ACTION_PROLOGUE;
	CALL_ACTION(A_Scream, self);
	A_Unblock(self, true);
	return 0;
}